

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O1

void R_RenderBSPNode(void *node)

{
  bool bVar1;
  double dVar2;
  short *psVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  uint uVar8;
  long lVar9;
  short *psVar10;
  node_t *bsp;
  subsector_t *sub;
  bool bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  sub = subsectors;
  if (numnodes != 0) {
    for (; ((ulong)node & 1) == 0; node = *(void **)((long)node + ((ulong)bVar1 * 2 + 0xe) * 4)) {
      lVar9 = (long)*(int *)((long)node + 0xc) *
              ((long)*node - (long)SUB84(ViewPos.X + 103079215104.0,0)) +
              (long)*(int *)((long)node + 8) *
              ((long)SUB84(ViewPos.Y + 103079215104.0,0) - (long)*(int *)((long)node + 4));
      bVar11 = (int)((ulong)lVar9 >> 0x20) == 0;
      bVar1 = bVar11 || lVar9 < 0;
      R_RenderBSPNode(*(void **)((long)node + ((ulong)(!bVar11 && lVar9 >= 0) * 2 + 0xe) * 4));
      pfVar7 = (float *)((long)node + ((ulong)bVar1 * 4 + 4) * 4);
      uVar8 = 0;
      uVar4 = 0;
      if ((double)*(float *)((long)node + ((ulong)bVar1 * 4 + 6) * 4) < ViewPos.X) {
        uVar4 = 2 - (ViewPos.X < (double)*(float *)((long)node + ((ulong)bVar1 * 4 + 7) * 4));
      }
      if (ViewPos.Y < (double)*pfVar7) {
        uVar8 = (uint)(ViewPos.Y <= (double)*(float *)((long)node + ((ulong)bVar1 * 4 + 5) * 4)) * 4
                + 4;
      }
      uVar8 = uVar8 | uVar4;
      bVar11 = true;
      if (uVar8 != 5) {
        dVar14 = (double)pfVar7[checkcoord[uVar8][0]] - ViewPos.X;
        dVar2 = (double)pfVar7[checkcoord[uVar8][1]] - ViewPos.Y;
        if (((double)pfVar7[checkcoord[uVar8][3]] - (double)pfVar7[checkcoord[uVar8][1]]) * dVar14 +
            ((double)pfVar7[checkcoord[uVar8][0]] - (double)pfVar7[checkcoord[uVar8][2]]) * dVar2 <
            -1.52587890625e-05) {
          dVar15 = (double)pfVar7[checkcoord[uVar8][3]] - ViewPos.Y;
          dVar16 = (double)pfVar7[checkcoord[uVar8][2]] - ViewPos.X;
          dVar13 = ViewSin * dVar14 - ViewCos * dVar2;
          dVar12 = ViewSin * dVar16 - ViewCos * dVar15;
          dVar2 = dVar2 * ViewTanSin + dVar14 * ViewTanCos;
          dVar14 = dVar15 * ViewTanSin + dVar16 * ViewTanCos;
          dVar15 = dVar2;
          if (((byte)MirrorFlags & 1) != 0) {
            dVar15 = -dVar13;
            dVar13 = -dVar12;
            dVar12 = dVar15;
            dVar15 = dVar14;
            dVar14 = dVar2;
          }
          if (-dVar15 <= dVar13) {
            bVar11 = false;
            if ((dVar13 <= dVar15) && (dVar15 != 0.0)) {
              iVar6 = SUB84(CenterX + 6755399441055744.0 + (CenterX * dVar13) / dVar15,0);
              goto LAB_00301f40;
            }
          }
          else {
            iVar6 = 0;
            if ((-dVar14 <= dVar12) && (dVar13 + dVar15 != dVar12 + dVar14)) {
LAB_00301f40:
              if (dVar12 <= dVar14) {
                bVar11 = false;
                if ((dVar12 < -dVar14) || (dVar14 == 0.0)) goto LAB_00301fbe;
                iVar5 = SUB84(CenterX + 6755399441055744.0 + (dVar12 * CenterX) / dVar14,0);
              }
              else if ((dVar15 < dVar13) || (iVar5 = viewwidth, dVar13 + dVar14 == dVar12 + dVar15))
              goto LAB_00301fbc;
              if (iVar6 < iVar5) {
                psVar3 = &solidsegs[0].last;
                do {
                  psVar10 = psVar3;
                  psVar3 = psVar10 + 2;
                } while (*psVar10 < iVar5);
                bVar11 = iVar6 < ((cliprange_t *)(psVar10 + -1))->first;
                goto LAB_00301fbe;
              }
            }
LAB_00301fbc:
            bVar11 = false;
          }
        }
      }
LAB_00301fbe:
      if (!bVar11) {
        return;
      }
    }
    sub = (subsector_t *)((long)node + -1);
  }
  R_Subsector(sub);
  return;
}

Assistant:

void R_RenderBSPNode (void *node)
{
	if (numnodes == 0)
	{
		R_Subsector (subsectors);
		return;
	}
	while (!((size_t)node & 1))  // Keep going until found a subsector
	{
		node_t *bsp = (node_t *)node;

		// Decide which side the view point is on.
		int side = R_PointOnSide (ViewPos, bsp);

		// Recursively divide front space (toward the viewer).
		R_RenderBSPNode (bsp->children[side]);

		// Possibly divide back space (away from the viewer).
		side ^= 1;
		if (!R_CheckBBox (bsp->bbox[side]))
			return;

		node = bsp->children[side];
	}
	R_Subsector ((subsector_t *)((BYTE *)node - 1));
}